

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

bool libcellml::traverseComponentEntityTreeLinkingUnits
               (ComponentEntityPtr *componentEntity,DescriptionList *descriptionList)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool local_91;
  bool local_6a;
  shared_ptr<libcellml::ComponentEntity> local_68;
  undefined1 local_58 [8];
  ComponentPtr c;
  size_t index;
  bool local_29;
  undefined1 local_28 [7];
  bool status;
  shared_ptr<libcellml::Component> component;
  DescriptionList *descriptionList_local;
  ComponentEntityPtr *componentEntity_local;
  
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)descriptionList;
  std::dynamic_pointer_cast<libcellml::Component,libcellml::ComponentEntity>
            ((shared_ptr<libcellml::ComponentEntity> *)local_28);
  bVar2 = std::operator!=((shared_ptr<libcellml::Component> *)local_28,(nullptr_t)0x0);
  if (bVar2) {
    local_6a = linkComponentVariableUnits
                         ((ComponentPtr *)local_28,
                          (DescriptionList *)
                          component.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
  }
  else {
    local_6a = true;
  }
  local_29 = local_6a;
  c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    peVar3 = std::
             __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ComponentEntity::componentCount(peVar3)
    ;
    if (p_Var4 <= _Var1._M_pi) break;
    peVar3 = std::
             __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    ComponentEntity::component((ComponentEntity *)local_58,(size_t)peVar3);
    std::shared_ptr<libcellml::ComponentEntity>::shared_ptr<libcellml::Component,void>
              (&local_68,(shared_ptr<libcellml::Component> *)local_58);
    bVar2 = traverseComponentEntityTreeLinkingUnits
                      (&local_68,
                       (DescriptionList *)
                       component.
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    local_91 = false;
    if (bVar2) {
      local_91 = local_29;
    }
    local_29 = local_91;
    std::shared_ptr<libcellml::ComponentEntity>::~shared_ptr(&local_68);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_58)
    ;
    c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_vptr__Sp_counted_base + 1);
  }
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_28);
  return local_29;
}

Assistant:

bool traverseComponentEntityTreeLinkingUnits(const ComponentEntityPtr &componentEntity, DescriptionList &descriptionList)
{
    auto component = std::dynamic_pointer_cast<Component>(componentEntity);
    bool status = (component != nullptr) ?
                      linkComponentVariableUnits(component, descriptionList) :
                      true;
    for (size_t index = 0; index < componentEntity->componentCount(); ++index) {
        auto c = componentEntity->component(index);
        status = traverseComponentEntityTreeLinkingUnits(c, descriptionList) && status;
    }
    return status;
}